

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

OutPt * __thiscall ClipperLib::Clipper::AddOutPt(Clipper *this,TEdge *e,IntPoint *pt)

{
  EdgeSide EVar1;
  int iVar2;
  OutPt *pOVar3;
  OutPt *pOVar4;
  cInt cVar5;
  int iVar6;
  OutRec *pOVar7;
  OutPt *pOVar8;
  ClipperBase *this_00;
  
  this_00 = (ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
  if ((long)e->OutIdx < 0) {
    pOVar7 = ClipperBase::CreateOutRec(this_00);
    iVar2 = e->WindDelta;
    pOVar7->IsOpen = iVar2 == 0;
    pOVar8 = (OutPt *)operator_new(0x28);
    pOVar7->Pts = pOVar8;
    iVar6 = pOVar7->Idx;
    pOVar8->Idx = iVar6;
    cVar5 = pt->Y;
    (pOVar8->Pt).X = pt->X;
    (pOVar8->Pt).Y = cVar5;
    pOVar8->Next = pOVar8;
    pOVar8->Prev = pOVar8;
    if (iVar2 != 0) {
      SetHoleState(this,e,pOVar7);
      iVar6 = pOVar7->Idx;
    }
    e->OutIdx = iVar6;
  }
  else {
    pOVar7 = (this_00->m_PolyOuts).
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl
             .super__Vector_impl_data._M_start[e->OutIdx];
    pOVar3 = pOVar7->Pts;
    EVar1 = e->Side;
    if (EVar1 == esLeft) {
      if ((pt->X == (pOVar3->Pt).X) && (pt->Y == (pOVar3->Pt).Y)) {
        return pOVar3;
      }
    }
    else {
      pOVar8 = pOVar3->Prev;
      if ((pt->X == (pOVar8->Pt).X) && (pt->Y == (pOVar8->Pt).Y)) {
        return pOVar8;
      }
    }
    pOVar8 = (OutPt *)operator_new(0x28);
    pOVar8->Idx = pOVar7->Idx;
    cVar5 = pt->Y;
    (pOVar8->Pt).X = pt->X;
    (pOVar8->Pt).Y = cVar5;
    pOVar8->Next = pOVar3;
    pOVar4 = pOVar3->Prev;
    pOVar8->Prev = pOVar4;
    pOVar4->Next = pOVar8;
    pOVar3->Prev = pOVar8;
    if (EVar1 == esLeft) {
      pOVar7->Pts = pOVar8;
    }
  }
  return pOVar8;
}

Assistant:

OutPt* Clipper::AddOutPt(TEdge *e, const IntPoint &pt)
{
  if(  e->OutIdx < 0 )
  {
    OutRec *outRec = CreateOutRec();
    outRec->IsOpen = (e->WindDelta == 0);
    OutPt* newOp = new OutPt;
    outRec->Pts = newOp;
    newOp->Idx = outRec->Idx;
    newOp->Pt = pt;
    newOp->Next = newOp;
    newOp->Prev = newOp;
    if (!outRec->IsOpen)
      SetHoleState(e, outRec);
    e->OutIdx = outRec->Idx;
    return newOp;
  } else
  {
    OutRec *outRec = m_PolyOuts[e->OutIdx];
    //OutRec.Pts is the 'Left-most' point & OutRec.Pts.Prev is the 'Right-most'
    OutPt* op = outRec->Pts;

	bool ToFront = (e->Side == esLeft);
	if (ToFront && (pt == op->Pt)) return op;
    else if (!ToFront && (pt == op->Prev->Pt)) return op->Prev;

    OutPt* newOp = new OutPt;
    newOp->Idx = outRec->Idx;
    newOp->Pt = pt;
    newOp->Next = op;
    newOp->Prev = op->Prev;
    newOp->Prev->Next = newOp;
    op->Prev = newOp;
    if (ToFront) outRec->Pts = newOp;
    return newOp;
  }
}